

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_BrepFace::IsValid(ON_BrepFace *this,ON_TextLog *text_log)

{
  int iVar1;
  ON_TextLog *text_log_local;
  ON_BrepFace *this_local;
  
  if (this->m_face_index < 0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_BrepFace m_face_index = %d.  Should be >= 0.\n",
                        (ulong)(uint)this->m_face_index);
    }
    this_local._7_1_ = false;
  }
  else {
    iVar1 = ON_SimpleArray<int>::Count(&this->m_li);
    if (iVar1 < 1) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_BrepFace m_li.Count() = 0  Should be > 0.\n");
      }
      this_local._7_1_ = false;
    }
    else if (this->m_si < 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_BrepFace m_si = %d.  Should be >= 0.\n",
                          (ulong)(uint)this->m_si);
      }
      this_local._7_1_ = false;
    }
    else if (this->m_brep == (ON_Brep *)0x0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_BrepFace m_brep = 0.  Should point to parent brep.\n");
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BrepFace::IsValid( ON_TextLog* text_log ) const
{
  if ( m_face_index < 0 )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_face_index = %d.  Should be >= 0.\n",m_face_index);
    return false;
  }

  if ( m_li.Count() < 1 )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_li.Count() = 0  Should be > 0.\n");
    return false;
  }

  if ( m_si < 0 )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_si = %d.  Should be >= 0.\n",m_si);
    return false;
  }

  if ( 0 == m_brep )
  {
    if ( 0 != text_log )
      text_log->Print("ON_BrepFace m_brep = 0.  Should point to parent brep.\n");
    return false;

  }

  return true;
}